

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testJacobiEigenSolverImp<double>(void)

{
  Matrix44<double> local_640;
  Matrix44<double> local_5c0;
  Matrix44<double> local_540;
  Matrix44<double> local_4c0;
  Matrix33<double> *in_stack_fffffffffffffbc0;
  Matrix44<double> local_3c0;
  Matrix44<double> *in_stack_fffffffffffffd10;
  Matrix44<double> local_2c0;
  Matrix33<double> local_240;
  Matrix33<double> local_1f8;
  Matrix33<double> local_1b0;
  Matrix33<double> local_168;
  Matrix33<double> local_120;
  Matrix33<double> local_d8;
  Matrix33<double> local_90;
  Matrix33<double> local_48;
  
  Imath_3_2::Matrix33<double>::Matrix33(&local_48,&A33_1);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>(in_stack_fffffffffffffbc0);
  Imath_3_2::Matrix33<double>::Matrix33(&local_90,&A33_2);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>(in_stack_fffffffffffffbc0);
  Imath_3_2::Matrix33<double>::Matrix33(&local_d8,&A33_3);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>(in_stack_fffffffffffffbc0);
  Imath_3_2::Matrix33<double>::Matrix33(&local_120,&A33_4);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>(in_stack_fffffffffffffbc0);
  Imath_3_2::Matrix33<double>::Matrix33(&local_168,&A33_5);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>(in_stack_fffffffffffffbc0);
  Imath_3_2::Matrix33<double>::Matrix33(&local_1b0,&A33_6);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>(in_stack_fffffffffffffbc0);
  Imath_3_2::Matrix33<double>::Matrix33(&local_1f8,&A33_7);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>(in_stack_fffffffffffffbc0);
  Imath_3_2::Matrix33<double>::Matrix33(&local_240,&A33_8);
  testJacobiEigenSolver<Imath_3_2::Matrix33<double>>(in_stack_fffffffffffffbc0);
  Imath_3_2::Matrix44<double>::Matrix44(&local_2c0,&A44_1);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(in_stack_fffffffffffffd10);
  Imath_3_2::Matrix44<double>::Matrix44((Matrix44<double> *)&stack0xfffffffffffffcc0,&A44_2);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(in_stack_fffffffffffffd10);
  Imath_3_2::Matrix44<double>::Matrix44(&local_3c0,&A44_3);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(in_stack_fffffffffffffd10);
  Imath_3_2::Matrix44<double>::Matrix44((Matrix44<double> *)&stack0xfffffffffffffbc0,&A44_4);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(in_stack_fffffffffffffd10);
  Imath_3_2::Matrix44<double>::Matrix44(&local_4c0,&A44_5);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(in_stack_fffffffffffffd10);
  Imath_3_2::Matrix44<double>::Matrix44(&local_540,&A44_6);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(in_stack_fffffffffffffd10);
  Imath_3_2::Matrix44<double>::Matrix44(&local_5c0,&A44_7);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(in_stack_fffffffffffffd10);
  Imath_3_2::Matrix44<double>::Matrix44(&local_640,&A44_8);
  testJacobiEigenSolver<Imath_3_2::Matrix44<double>>(in_stack_fffffffffffffd10);
  return;
}

Assistant:

void
testJacobiEigenSolverImp ()
{
    testJacobiEigenSolver (Matrix33<T> (A33_1));
    testJacobiEigenSolver (Matrix33<T> (A33_2));
    testJacobiEigenSolver (Matrix33<T> (A33_3));
    testJacobiEigenSolver (Matrix33<T> (A33_4));
    testJacobiEigenSolver (Matrix33<T> (A33_5));
    testJacobiEigenSolver (Matrix33<T> (A33_6));
    testJacobiEigenSolver (Matrix33<T> (A33_7));
    testJacobiEigenSolver (Matrix33<T> (A33_8));

    testJacobiEigenSolver (Matrix44<T> (A44_1));
    testJacobiEigenSolver (Matrix44<T> (A44_2));
    testJacobiEigenSolver (Matrix44<T> (A44_3));
    testJacobiEigenSolver (Matrix44<T> (A44_4));
    testJacobiEigenSolver (Matrix44<T> (A44_5));
    testJacobiEigenSolver (Matrix44<T> (A44_6));
    testJacobiEigenSolver (Matrix44<T> (A44_7));
    testJacobiEigenSolver (Matrix44<T> (A44_8));
}